

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerReflection::emit_resources
          (CompilerReflection *this,char *tag,SmallVector<spirv_cross::Resource,_8UL> *resources)

{
  ID *__k;
  uint __val;
  Stream *pSVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  char cVar5;
  char cVar6;
  StorageClass SVar7;
  uint uVar8;
  uint32_t uVar9;
  mapped_type *pmVar10;
  Bitset *pBVar11;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  SPIRType *type;
  size_t sVar14;
  uint64_t uVar15;
  char *__s;
  size_t sVar16;
  byte bVar17;
  uint uVar18;
  size_type *psVar19;
  _Alloc_hider _Var20;
  Resource *pRVar21;
  Bitset buffer_flags;
  Bitset typeflags;
  undefined1 local_110 [64];
  string local_d0;
  Bitset *local_b0;
  SPIRType *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  uint local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  Resource *local_80;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_78;
  undefined1 local_70 [8];
  undefined1 local_68 [24];
  size_type local_50;
  _Prime_rehash_policy local_48;
  __node_base_ptr local_38;
  
  if ((resources->super_VectorView<spirv_cross::Resource>).buffer_size != 0) {
    pSVar1 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    ::std::__cxx11::string::string((string *)local_70,tag,(allocator *)local_110);
    simple_json::Stream::emit_json_key_array(pSVar1,(string *)local_70);
    if (local_70 != (undefined1  [8])(local_68 + 8)) {
      operator_delete((void *)local_70);
    }
    sVar14 = (resources->super_VectorView<spirv_cross::Resource>).buffer_size;
    if (sVar14 != 0) {
      pRVar21 = (resources->super_VectorView<spirv_cross::Resource>).ptr;
      local_80 = pRVar21 + sVar14;
      local_78 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_CompilerGLSL).super_Compiler.ir.meta;
      do {
        local_a8 = Compiler::get_type((Compiler *)this,(TypeID)(pRVar21->type_id).id);
        __k = &(local_a8->super_IVariant).self;
        pmVar10 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](local_78,__k);
        local_70 = (undefined1  [8])(pmVar10->decoration).decoration_flags.lower;
        local_110._0_8_ = local_68;
        local_68._0_8_ = (__buckets_ptr)0x0;
        local_68._8_8_ = (pmVar10->decoration).decoration_flags.higher._M_h._M_bucket_count;
        local_68._16_8_ = 0;
        local_50 = (pmVar10->decoration).decoration_flags.higher._M_h._M_element_count;
        pBVar11 = &(pmVar10->decoration).decoration_flags;
        local_48._M_max_load_factor = (pBVar11->higher)._M_h._M_rehash_policy._M_max_load_factor;
        local_48._4_4_ = *(undefined4 *)&(pBVar11->higher)._M_h._M_rehash_policy.field_0x4;
        local_48._M_next_resize =
             (pmVar10->decoration).decoration_flags.higher._M_h._M_rehash_policy._M_next_resize;
        local_38 = (__node_base_ptr)0x0;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_110._0_8_,&(pmVar10->decoration).decoration_flags.higher._M_h,
                   (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,_false>_>_> *)
                   local_110);
        local_b0 = Compiler::get_decoration_bitset((Compiler *)this,(ID)(pRVar21->id).id);
        SVar7 = Compiler::get_storage_class((Compiler *)this,(VariableID)(pRVar21->id).id);
        pBVar11 = Compiler::get_decoration_bitset((Compiler *)this,(ID)__k->id);
        bVar17 = 1;
        if ((pBVar11->lower & 4) == 0) {
          pBVar11 = Compiler::get_decoration_bitset((Compiler *)this,(ID)__k->id);
          bVar17 = ((byte)pBVar11->lower & 8) >> 3;
        }
        uVar8 = (&pRVar21->id)[(ulong)(SVar7 != StorageClassPushConstant & bVar17) * 2].id;
        simple_json::Stream::begin_json_object
                  ((this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_110._0_8_ = local_110 + 0x10;
        if (*(int *)&(local_a8->super_IVariant).field_0xc == 0xf) {
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"type","");
          __val = (pRVar21->base_type_id).id;
          cVar6 = '\x01';
          if (9 < __val) {
            uVar18 = __val;
            cVar5 = '\x04';
            do {
              cVar6 = cVar5;
              if (uVar18 < 100) {
                cVar6 = cVar6 + -2;
                goto LAB_002415f9;
              }
              if (uVar18 < 1000) {
                cVar6 = cVar6 + -1;
                goto LAB_002415f9;
              }
              if (uVar18 < 10000) goto LAB_002415f9;
              bVar4 = 99999 < uVar18;
              uVar18 = uVar18 / 10000;
              cVar5 = cVar6 + '\x04';
            } while (bVar4);
            cVar6 = cVar6 + '\x01';
          }
LAB_002415f9:
          local_a0 = &local_90;
          ::std::__cxx11::string::_M_construct((ulong)&local_a0,cVar6);
          ::std::__detail::__to_chars_10_impl<unsigned_int>(local_a0->_M_local_buf,local_98,__val);
          plVar12 = (long *)::std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x2e3de5)
          ;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          psVar19 = (size_type *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_d0.field_2._M_allocated_capacity = *psVar19;
            local_d0.field_2._8_8_ = plVar12[3];
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar19;
            local_d0._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_d0._M_string_length = plVar12[1];
          *plVar12 = (long)psVar19;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          simple_json::Stream::emit_json_key_value(pSVar1,(string *)local_110,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          paVar13 = &local_90;
          _Var20._M_p = (pointer)local_a0;
        }
        else {
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"type","");
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_d0,this,local_a8,0);
          simple_json::Stream::emit_json_key_value(pSVar1,(string *)local_110,&local_d0);
          paVar13 = &local_d0.field_2;
          _Var20._M_p = local_d0._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var20._M_p != paVar13) {
          operator_delete(_Var20._M_p);
        }
        if ((__hashtable_alloc *)local_110._0_8_ != (__hashtable_alloc *)(local_110 + 0x10)) {
          operator_delete((void *)local_110._0_8_);
        }
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_110._0_8_ = local_110 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"name","");
        sVar2 = (pRVar21->name)._M_string_length;
        if (sVar2 == 0) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[3])
                    (&local_d0,this,(ulong)uVar8);
        }
        else {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          pcVar3 = (pRVar21->name)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>((string *)&local_d0,pcVar3,pcVar3 + sVar2);
        }
        simple_json::Stream::emit_json_key_value(pSVar1,(string *)local_110,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((__hashtable_alloc *)local_110._0_8_ != (__hashtable_alloc *)(local_110 + 0x10)) {
          operator_delete((void *)local_110._0_8_);
        }
        if ((local_a8->storage == StorageClassStorageBuffer) ||
           ((local_a8->storage == StorageClassUniform && (((ulong)local_70 & 8) != 0)))) {
          Compiler::get_buffer_block_flags
                    ((Bitset *)local_110,(Compiler *)this,(VariableID)(pRVar21->id).id);
          uVar8 = (uint)local_110._0_8_;
          if ((uVar8 >> 0x19 & 1) != 0) {
            pSVar1 = (this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"writeonly","");
            simple_json::Stream::emit_json_key(pSVar1,&local_d0);
            StringStream<4096UL,_4096UL>::append(&pSVar1->buffer,"true",4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            uVar8 = (uint)local_110._0_8_;
          }
          if ((uVar8 >> 0x18 & 1) != 0) {
            pSVar1 = (this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"readonly","");
            simple_json::Stream::emit_json_key(pSVar1,&local_d0);
            StringStream<4096UL,_4096UL>::append(&pSVar1->buffer,"true",4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            uVar8 = (uint)local_110._0_8_;
          }
          if ((uVar8 >> 0x13 & 1) != 0) {
            pSVar1 = (this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"restrict","");
            simple_json::Stream::emit_json_key(pSVar1,&local_d0);
            StringStream<4096UL,_4096UL>::append(&pSVar1->buffer,"true",4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            uVar8 = (uint)local_110._0_8_;
          }
          if ((uVar8 >> 0x17 & 1) != 0) {
            pSVar1 = (this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"coherent","");
            simple_json::Stream::emit_json_key(pSVar1,&local_d0);
            StringStream<4096UL,_4096UL>::append(&pSVar1->buffer,"true",4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
          }
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)(local_110 + 8));
        }
        emit_type_array(this,local_a8);
        if ((bVar17 != 0) &&
           (((SVar7 = Compiler::get_storage_class((Compiler *)this,(VariableID)(pRVar21->id).id),
             SVar7 == StorageClassUniform ||
             (SVar7 = Compiler::get_storage_class((Compiler *)this,(VariableID)(pRVar21->id).id),
             SVar7 == StorageClassUniformConstant)) ||
            (SVar7 = Compiler::get_storage_class((Compiler *)this,(VariableID)(pRVar21->id).id),
            SVar7 == StorageClassStorageBuffer)))) {
          type = Compiler::get_type((Compiler *)this,(TypeID)(pRVar21->base_type_id).id);
          sVar14 = Compiler::get_declared_struct_size((Compiler *)this,type);
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_110._0_8_ = local_110 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"block_size","");
          simple_json::Stream::emit_json_key(pSVar1,(string *)local_110);
          StringStream<4096UL,_4096UL>::operator<<(&pSVar1->buffer,(uint32_t)sVar14);
          if ((__hashtable_alloc *)local_110._0_8_ != (__hashtable_alloc *)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_);
          }
        }
        if (local_a8->storage == StorageClassPushConstant) {
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_110._0_8_ = local_110 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"push_constant","");
          simple_json::Stream::emit_json_key(pSVar1,(string *)local_110);
          StringStream<4096UL,_4096UL>::append(&pSVar1->buffer,"true",4);
          if ((__hashtable_alloc *)local_110._0_8_ != (__hashtable_alloc *)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_);
          }
        }
        uVar15 = local_b0->lower;
        if (((uint)uVar15 >> 0x1e & 1) != 0) {
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_110._0_8_ = local_110 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"location","");
          uVar9 = Compiler::get_decoration((Compiler *)this,(ID)(pRVar21->id).id,DecorationLocation)
          ;
          simple_json::Stream::emit_json_key(pSVar1,(string *)local_110);
          StringStream<4096UL,_4096UL>::operator<<(&pSVar1->buffer,uVar9);
          if ((__hashtable_alloc *)local_110._0_8_ != (__hashtable_alloc *)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_);
          }
          uVar15 = local_b0->lower;
        }
        if ((uVar15 & 0x10) != 0) {
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_110._0_8_ = local_110 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"row_major","");
          simple_json::Stream::emit_json_key(pSVar1,(string *)local_110);
          StringStream<4096UL,_4096UL>::append(&pSVar1->buffer,"true",4);
          if ((__hashtable_alloc *)local_110._0_8_ != (__hashtable_alloc *)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_);
          }
          uVar15 = local_b0->lower;
        }
        if ((uVar15 & 0x20) != 0) {
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_110._0_8_ = local_110 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"column_major","");
          simple_json::Stream::emit_json_key(pSVar1,(string *)local_110);
          StringStream<4096UL,_4096UL>::append(&pSVar1->buffer,"true",4);
          if ((__hashtable_alloc *)local_110._0_8_ != (__hashtable_alloc *)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_);
          }
          uVar15 = local_b0->lower;
        }
        if ((uVar15 >> 0x20 & 1) != 0) {
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_110._0_8_ = local_110 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"index","");
          uVar9 = Compiler::get_decoration((Compiler *)this,(ID)(pRVar21->id).id,DecorationIndex);
          simple_json::Stream::emit_json_key(pSVar1,(string *)local_110);
          StringStream<4096UL,_4096UL>::operator<<(&pSVar1->buffer,uVar9);
          if ((__hashtable_alloc *)local_110._0_8_ != (__hashtable_alloc *)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_);
          }
          uVar15 = local_b0->lower;
        }
        if ((local_a8->storage != StorageClassPushConstant) && ((uVar15 & 0x400000000) != 0)) {
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_110._0_8_ = local_110 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"set","");
          uVar9 = Compiler::get_decoration
                            ((Compiler *)this,(ID)(pRVar21->id).id,DecorationDescriptorSet);
          simple_json::Stream::emit_json_key(pSVar1,(string *)local_110);
          StringStream<4096UL,_4096UL>::operator<<(&pSVar1->buffer,uVar9);
          if ((__hashtable_alloc *)local_110._0_8_ != (__hashtable_alloc *)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_);
          }
          uVar15 = local_b0->lower;
        }
        if ((uVar15 >> 0x21 & 1) != 0) {
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_110._0_8_ = local_110 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"binding","");
          uVar9 = Compiler::get_decoration((Compiler *)this,(ID)(pRVar21->id).id,DecorationBinding);
          simple_json::Stream::emit_json_key(pSVar1,(string *)local_110);
          StringStream<4096UL,_4096UL>::operator<<(&pSVar1->buffer,uVar9);
          if ((__hashtable_alloc *)local_110._0_8_ != (__hashtable_alloc *)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_);
          }
          uVar15 = local_b0->lower;
        }
        if ((uVar15 >> 0x2b & 1) != 0) {
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_110._0_8_ = local_110 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_110,"input_attachment_index","");
          uVar9 = Compiler::get_decoration
                            ((Compiler *)this,(ID)(pRVar21->id).id,DecorationInputAttachmentIndex);
          simple_json::Stream::emit_json_key(pSVar1,(string *)local_110);
          StringStream<4096UL,_4096UL>::operator<<(&pSVar1->buffer,uVar9);
          if ((__hashtable_alloc *)local_110._0_8_ != (__hashtable_alloc *)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_);
          }
          uVar15 = local_b0->lower;
        }
        if ((uVar15 >> 0x23 & 1) != 0) {
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_110._0_8_ = local_110 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"offset","");
          uVar9 = Compiler::get_decoration((Compiler *)this,(ID)(pRVar21->id).id,DecorationOffset);
          simple_json::Stream::emit_json_key(pSVar1,(string *)local_110);
          StringStream<4096UL,_4096UL>::operator<<(&pSVar1->buffer,uVar9);
          if ((__hashtable_alloc *)local_110._0_8_ != (__hashtable_alloc *)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_);
          }
        }
        if (((*(int *)&(local_a8->super_IVariant).field_0xc == 0x10) &&
            ((local_a8->image).sampled == 2)) &&
           (__s = CompilerGLSL::format_to_glsl(&this->super_CompilerGLSL,(local_a8->image).format),
           __s != (char *)0x0)) {
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_110._0_8_ = local_110 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"format","");
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          sVar16 = strlen(__s);
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,__s,__s + sVar16);
          simple_json::Stream::emit_json_key_value(pSVar1,(string *)local_110,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((__hashtable_alloc *)local_110._0_8_ != (__hashtable_alloc *)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_);
          }
        }
        simple_json::Stream::end_json_object
                  ((this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_68);
        pRVar21 = pRVar21 + 1;
      } while (pRVar21 != local_80);
    }
    simple_json::Stream::end_json_array
              ((this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void statement_no_return(Ts &&... ts)
	{
		statement_indent();
		statement_inner(std::forward<Ts>(ts)...);
	}